

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O1

size_t StringToken_GetLength(STRING_TOKEN_HANDLE token)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  
  if (token == (STRING_TOKEN_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_token.c"
                ,"StringToken_GetLength",0x102,1,"Invalig argument (token is NULL)");
      return 0;
    }
  }
  else if (token->token_start != (char *)0x0) {
    pcVar2 = token->delimiter_start;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = token->source + token->length;
    }
    return (long)pcVar2 - (long)token->token_start;
  }
  return 0;
}

Assistant:

size_t StringToken_GetLength(STRING_TOKEN_HANDLE token)
{
    size_t result;

    // Codes_SRS_STRING_TOKENIZER_09_015: [ If token is NULL the function shall return zero ]
    if (token == NULL)
    {
        LogError("Invalig argument (token is NULL)");
        result = 0;
    }
    // Codes_SRS_STRING_TOKENIZER_09_016: [ The function shall return the length of the current token ]
    else if (token->token_start == NULL)
    {
        result = 0;
    }
    else if (token->delimiter_start == NULL)
    {
        result = token->source + token->length - token->token_start;
    }
    else
    {
        result = token->delimiter_start - token->token_start;
    }

    return result;
}